

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O0

double __thiscall soul::WaveGenerators::Square::getSample(Square *this)

{
  double dVar1;
  double dVar2;
  float local_14;
  Square *this_local;
  
  local_14 = -1.0;
  if (0.5 <= (this->super_Blep).super_Generator.currentPhase) {
    local_14 = 1.0;
  }
  dVar1 = Blep::blep(&this->super_Blep,(this->super_Blep).super_Generator.currentPhase);
  dVar2 = fmod((this->super_Blep).super_Generator.currentPhase + 0.5,1.0);
  dVar2 = Blep::blep(&this->super_Blep,dVar2);
  return ((double)local_14 - dVar1) + dVar2;
}

Assistant:

double getSample() override
        {
            return (currentPhase < 0.5 ? -1.0f : 1.0f) - blep (currentPhase)
                    + blep (std::fmod (currentPhase + 0.5, 1.0));
        }